

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O2

void __thiscall
pbrt::SPPMIntegrator::SPPMIntegrator
          (SPPMIntegrator *this,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,
          int photonsPerIteration,int maxDepth,Float initialSearchRadius,int seed,
          RGBColorSpace *colorSpace)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  _Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_50;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_38;
  
  local_38.bits =
       (aggregate->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_50,lights);
  Integrator::Integrator
            (&this->super_Integrator,(PrimitiveHandle *)&local_38,
             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_50);
  std::_Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~_Vector_base(&local_50)
  ;
  (this->super_Integrator)._vptr_Integrator = (_func_int **)&PTR__Integrator_02db6fe8;
  (this->camera).
  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  .bits = 0;
  uVar3 = (camera->
          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
          ).bits;
  (this->camera).
  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  .bits = uVar3;
  this->initialSearchRadius = initialSearchRadius;
  (this->samplerPrototype).
  super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  .bits = 0;
  (this->samplerPrototype).
  super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  .bits = (sampler->
          super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
          ).bits;
  this->digitPermutationsSeed = seed;
  this->maxDepth = maxDepth;
  if (photonsPerIteration < 1) {
    uVar3 = *(ulong *)((uVar3 & 0xffffffffffff) + 0x340) & 0xffffffffffff;
    uVar1 = *(undefined8 *)(uVar3 + 8);
    uVar2 = *(undefined8 *)(uVar3 + 0x10);
    photonsPerIteration =
         ((int)((ulong)uVar2 >> 0x20) - (int)((ulong)uVar1 >> 0x20)) * ((int)uVar2 - (int)uVar1);
  }
  this->photonsPerIteration = photonsPerIteration;
  this->colorSpace = colorSpace;
  return;
}

Assistant:

SPPMIntegrator(CameraHandle camera, SamplerHandle sampler, PrimitiveHandle aggregate,
                   std::vector<LightHandle> lights, int photonsPerIteration, int maxDepth,
                   Float initialSearchRadius, int seed, const RGBColorSpace *colorSpace)
        : Integrator(aggregate, lights),
          camera(camera),
          samplerPrototype(sampler),
          initialSearchRadius(initialSearchRadius),
          maxDepth(maxDepth),
          photonsPerIteration(photonsPerIteration > 0
                                  ? photonsPerIteration
                                  : camera.GetFilm().PixelBounds().Area()),
          colorSpace(colorSpace),
          digitPermutationsSeed(seed) {}